

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O0

void adios2::helper::anon_unknown_0::SetOption<bool>
               (bool *value,string *nodeName,Node *upperNode,string *hint,bool mandatory)

{
  bool bVar1;
  string *in_RSI;
  undefined8 in_RDI;
  Node node;
  value in_stack_00000180;
  bool in_stack_00000187;
  string *in_stack_00000188;
  Node *in_stack_00000190;
  string *in_stack_00000198;
  Node *this;
  string local_88 [8];
  Node *in_stack_ffffffffffffff80;
  
  this = (Node *)local_88;
  std::__cxx11::string::string((string *)this,in_RSI);
  YAMLNode(in_stack_00000198,in_stack_00000190,in_stack_00000188,in_stack_00000187,in_stack_00000180
          );
  std::__cxx11::string::~string(local_88);
  bVar1 = YAML::Node::operator_cast_to_bool((Node *)0x9d9d1a);
  if (bVar1) {
    bVar1 = YAML::Node::as<bool>(in_stack_ffffffffffffff80);
    *(bool *)in_RDI = bVar1;
  }
  YAML::Node::~Node(this);
  return;
}

Assistant:

void SetOption(T &value, const std::string nodeName, const YAML::Node &upperNode,
               const std::string &hint, bool mandatory = isNotMandatory)
{
    auto node = YAMLNode(nodeName, upperNode, hint, mandatory, YAML::NodeType::Scalar);
    if (node)
    {
        value = node.as<T>();
    }
}